

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

__ssize_t cs_impl::istream_cs_ext::getline_abi_cxx11_(char **__lineptr,size_t *__n,FILE *__stream)

{
  element_type *peVar1;
  string str;
  __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this;
  string local_30 [32];
  size_t *local_10;
  char **local_8;
  
  this = (__shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          *)__lineptr;
  local_10 = __n;
  local_8 = __lineptr;
  std::__cxx11::string::string(local_30);
  peVar1 = std::
           __shared_ptr_access<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(peVar1,local_30);
  std::__cxx11::string::string((string *)__lineptr,local_30);
  std::__cxx11::string::~string(local_30);
  return (__ssize_t)this;
}

Assistant:

string getline(istream &in)
		{
			std::string str;
			std::getline(*in, str);
			return std::move(str);
		}